

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

float_t __thiscall djb::microfacet::ndf(microfacet *this,vec3 *wm,args *args)

{
  float extraout_XMM0_Da;
  float fVar1;
  vec3 vVar2;
  
  vVar2 = djb::operator*(&args->mtra,wm);
  fVar1 = vVar2.z * vVar2.z + vVar2.x * vVar2.x + vVar2.y * vVar2.y;
  if (0.0 < fVar1) {
    (*(this->super_brdf)._vptr_brdf[0xb])(this);
    return extraout_XMM0_Da * (args->detm / (fVar1 * fVar1));
  }
  __assert_fail("x > T(0)",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                ,0x259,"T djb::inversesqrt(const T &) [T = float]");
}

Assistant:

float_t microfacet::ndf(const vec3 &wm, const args &args) const
{
	vec3 wm_std = args.mtra * wm;
	float_t nrmsqr = dot(wm_std, wm_std);
	return ndf_std(wm_std * inversesqrt(nrmsqr)) * (args.detm / sqr(nrmsqr));
}